

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

int mp_read_radix(mp_int *a,char *str,int radix)

{
  char cVar1;
  int iVar2;
  __int32_t **pp_Var3;
  int iVar4;
  char *pcVar5;
  char cVar6;
  long lVar7;
  ulong uVar8;
  
  a->sign = 0;
  a->used = 0;
  iVar2 = a->alloc;
  lVar7 = (long)iVar2;
  if (0 < lVar7) {
    memset(a->dp,0,lVar7 * 8);
  }
  iVar4 = -3;
  if (0xffffffc0 < radix - 0x41U) {
    cVar1 = *str;
    pcVar5 = str + (cVar1 == '-');
    iVar4 = 0;
    a->sign = 0;
    a->used = 0;
    if (0 < iVar2) {
      memset(a->dp,0,lVar7 << 3);
    }
    cVar6 = *pcVar5;
    if (cVar6 != '\0') {
      do {
        if ((uint)radix < 0x24) {
          pp_Var3 = __ctype_toupper_loc();
          cVar6 = (char)(*pp_Var3)[cVar6];
        }
        uVar8 = 0;
        do {
          if (cVar6 == mp_s_rmap[uVar8]) goto LAB_001084c0;
          uVar8 = uVar8 + 1;
        } while (uVar8 != 0x40);
        uVar8 = 0x40;
LAB_001084c0:
        if (radix <= (int)uVar8) break;
        iVar2 = mp_mul_d(a,(ulong)(uint)radix,a);
        if (iVar2 != 0) {
          return iVar2;
        }
        iVar2 = mp_add_d(a,uVar8 & 0xffffffff,a);
        if (iVar2 != 0) {
          return iVar2;
        }
        cVar6 = pcVar5[1];
        pcVar5 = pcVar5 + 1;
      } while (cVar6 != '\0');
      iVar4 = 0;
      if (a->used != 0) {
        a->sign = (uint)(cVar1 == '-');
      }
    }
  }
  return iVar4;
}

Assistant:

int mp_read_radix (mp_int * a, const char *str, int radix)
{
  int     y, res, neg;
  char    ch;

  /* zero the digit bignum */
  mp_zero(a);

  /* make sure the radix is ok */
  if (radix < 2 || radix > 64) {
    return MP_VAL;
  }

  /* if the leading digit is a 
   * minus set the sign to negative. 
   */
  if (*str == '-') {
    ++str;
    neg = MP_NEG;
  } else {
    neg = MP_ZPOS;
  }

  /* set the integer to the default of zero */
  mp_zero (a);
  
  /* process each digit of the string */
  while (*str) {
    /* if the radix < 36 the conversion is case insensitive
     * this allows numbers like 1AB and 1ab to represent the same  value
     * [e.g. in hex]
     */
    ch = (char) ((radix < 36) ? toupper (*str) : *str);
    for (y = 0; y < 64; y++) {
      if (ch == mp_s_rmap[y]) {
         break;
      }
    }

    /* if the char was found in the map 
     * and is less than the given radix add it
     * to the number, otherwise exit the loop. 
     */
    if (y < radix) {
      if ((res = mp_mul_d (a, (mp_digit) radix, a)) != MP_OKAY) {
         return res;
      }
      if ((res = mp_add_d (a, (mp_digit) y, a)) != MP_OKAY) {
         return res;
      }
    } else {
      break;
    }
    ++str;
  }
  
  /* set the sign only if a != 0 */
  if (mp_iszero(a) != 1) {
     a->sign = neg;
  }
  return MP_OKAY;
}